

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O1

bool __thiscall ON_Plane::SwapCoordinates(ON_Plane *this,int i,int j)

{
  bool bVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  ON_Xform xform;
  double local_b0 [16];
  
  if ((uint)j < 3 && (uint)i < 3) {
    pdVar2 = (double *)&ON_Xform::IdentityTransformation;
    pdVar4 = local_b0;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar4 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pdVar4 = pdVar4 + 1;
    }
    pdVar2 = ON_Xform::operator[]((ON_Xform *)local_b0,i);
    pdVar2[(uint)i] = 0.0;
    pdVar2 = ON_Xform::operator[]((ON_Xform *)local_b0,j);
    pdVar2[(uint)j] = 0.0;
    pdVar2 = ON_Xform::operator[]((ON_Xform *)local_b0,i);
    pdVar2[(uint)j] = 1.0;
    pdVar2 = ON_Xform::operator[]((ON_Xform *)local_b0,j);
    pdVar2[(uint)i] = 1.0;
    bVar1 = Transform(this,(ON_Xform *)local_b0);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_Plane::SwapCoordinates( int i, int j )
{
  bool rc = false;
  if ( 0 <= i && i < 3 && 0 <= j && j < 3 ) {
    ON_Xform xform(ON_Xform::IdentityTransformation);
    xform[i][i] = 0.0;
    xform[j][j] = 0.0;
    xform[i][j] = 1.0;
    xform[j][i] = 1.0;
    rc = Transform(xform);
  }
  return rc;
}